

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * file_makename(lemon *lemp,char *suffix)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  
  __s = outputDir;
  pcVar4 = lemp->filename;
  if (outputDir != (char *)0x0) {
    pcVar1 = strrchr(pcVar4,0x2f);
    if (pcVar1 != (char *)0x0) {
      pcVar4 = pcVar1 + 1;
    }
  }
  sVar2 = strlen(pcVar4);
  sVar3 = strlen(suffix);
  iVar5 = (int)sVar3 + (int)sVar2;
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    iVar5 = iVar5 + (int)sVar2 + 1;
  }
  pcVar1 = (char *)malloc((long)(iVar5 + 5));
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    if (__s != (char *)0x0) {
      lemon_strcpy(pcVar1,__s);
      lemon_strcat(pcVar1,"/");
    }
    lemon_strcat(pcVar1,pcVar4);
    pcVar4 = strrchr(pcVar1,0x2e);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    lemon_strcat(pcVar1,suffix);
    return pcVar1;
  }
  fwrite("Can\'t allocate space for a filename.\n",0x25,1,_stderr);
  exit(1);
}

Assistant:

PRIVATE char *file_makename(struct lemon *lemp, const char *suffix)
{
  char *name;
  char *cp;
  char *filename = lemp->filename;
  int sz;

  if( outputDir ){
    cp = strrchr(filename, '/');
    if( cp ) filename = cp + 1;
  }
  sz = lemonStrlen(filename);
  sz += lemonStrlen(suffix);
  if( outputDir ) sz += lemonStrlen(outputDir) + 1;
  sz += 5;
  name = (char*)malloc( sz );
  if( name==0 ){
    fprintf(stderr,"Can't allocate space for a filename.\n");
    exit(1);
  }
  name[0] = 0;
  if( outputDir ){
    lemon_strcpy(name, outputDir);
    lemon_strcat(name, "/");
  }
  lemon_strcat(name,filename);
  cp = strrchr(name,'.');
  if( cp ) *cp = 0;
  lemon_strcat(name,suffix);
  return name;
}